

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::continue_statement::print(continue_statement *this,wostream *os)

{
  std::operator<<(os,"continue_statement{");
  if ((this->id_)._M_string_length != 0) {
    std::operator<<(os,(wstring *)&this->id_);
  }
  std::operator<<(os,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "continue_statement{";
        if (!id_.empty()) {
            os << id_;
        }
        os << "}";
    }